

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::AddStore
          (InlinePass *this,uint32_t ptr_id,uint32_t val_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr,Instruction *line_inst,DebugScope *dbg_scope)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this_00;
  IRContext *c;
  pointer pIVar1;
  pointer this_01;
  Operand *local_150;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_148
  ;
  allocator<spvtools::opt::Operand> local_13d;
  uint32_t local_13c;
  iterator local_138;
  undefined8 local_130;
  SmallVector<unsigned_int,_2UL> local_128;
  uint32_t local_fc;
  iterator local_f8;
  undefined8 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  Operand local_c0;
  Operand OStack_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newStore;
  DebugScope *dbg_scope_local;
  Instruction *line_inst_local;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *block_ptr_local;
  uint32_t val_id_local;
  uint32_t ptr_id_local;
  InlinePass *this_local;
  
  newStore._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )dbg_scope;
  this_00 = (Instruction *)operator_new(0x70);
  c = Pass::context(&this->super_Pass);
  local_f8 = &local_fc;
  local_f0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_f8;
  local_fc = ptr_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list_00);
  Operand::Operand(&local_c0,SPV_OPERAND_TYPE_ID,&local_e8);
  local_138 = &local_13c;
  local_130 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_138;
  local_13c = val_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list);
  Operand::Operand(&OStack_90,SPV_OPERAND_TYPE_ID,&local_128);
  local_60 = &local_c0;
  local_58 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_13d);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_13d);
  Instruction::Instruction(this_00,c,OpStore,0,0,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_13d);
  local_150 = (Operand *)&local_60;
  do {
    local_150 = local_150 + -1;
    Operand::~Operand(local_150);
  } while (local_150 != &local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
  if (line_inst != (Instruction *)0x0) {
    pIVar1 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_38);
    Instruction::AddDebugLine(pIVar1,line_inst);
  }
  pIVar1 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_38);
  Instruction::SetDebugScope
            (pIVar1,(DebugScope *)
                    newStore._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  this_01 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(block_ptr);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_148,&local_38);
  BasicBlock::AddInstruction(this_01,&local_148);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_148);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  return;
}

Assistant:

void InlinePass::AddStore(uint32_t ptr_id, uint32_t val_id,
                          std::unique_ptr<BasicBlock>* block_ptr,
                          const Instruction* line_inst,
                          const DebugScope& dbg_scope) {
  std::unique_ptr<Instruction> newStore(
      new Instruction(context(), spv::Op::OpStore, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ptr_id}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {val_id}}}));
  if (line_inst != nullptr) {
    newStore->AddDebugLine(line_inst);
  }
  newStore->SetDebugScope(dbg_scope);
  (*block_ptr)->AddInstruction(std::move(newStore));
}